

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IncDecVerify.cpp
# Opt level: O2

void incdec_verify::PreDecTestUint8(void)

{
  uchar t;
  bool expected;
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  *pSVar1;
  long lVar2;
  allocator local_51;
  SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> si;
  
  for (lVar2 = 2; lVar2 != 0x1d; lVar2 = lVar2 + 3) {
    t = (&UNK_00159d9e)[lVar2];
    si.m_int = t;
    pSVar1 = SafeInt<unsigned_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             ::operator--(&si);
    expected = (bool)(&dec_uint8)[lVar2];
    if ((pSVar1->m_int == (&UNK_00159d9f)[lVar2]) != expected) {
      std::__cxx11::string::string((string *)&si,"Error in case dec_uint8 throw (1): ",&local_51);
      err_msg<unsigned_char>((string *)&si,t,expected);
      std::__cxx11::string::~string((string *)&si);
    }
  }
  return;
}

Assistant:

void PreDecTestUint8()
{
	size_t i;

	for( i = 0; i < COUNTOF(dec_uint8); ++i )
	{
		bool fSuccess = true;
		try
		{
			SafeInt<std::uint8_t> si(dec_uint8[i].x);
			SafeInt<std::uint8_t> vv = --si;

			if(vv != dec_uint8[i].y)
			{
				fSuccess = false;
			}
		}
		catch(SafeIntException&)
		{
			fSuccess = false;
		}

		if( fSuccess != dec_uint8[i].fExpected )
		{
			err_msg( "Error in case dec_uint8 throw (1): ", dec_uint8[i].x, dec_uint8[i].fExpected );
		}
	}
}